

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall
SubcommandProgram_Multiple_Test::~SubcommandProgram_Multiple_Test
          (SubcommandProgram_Multiple_Test *this)

{
  pointer pcVar1;
  
  (this->super_SubcommandProgram).super_TApp.super_Test._vptr_Test =
       (_func_int **)&PTR__SubcommandProgram_00177b90;
  pcVar1 = (this->super_SubcommandProgram).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SubcommandProgram).file.field_2) {
    operator_delete(pcVar1);
  }
  (this->super_SubcommandProgram).super_TApp.super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_00177178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_SubcommandProgram).super_TApp.args);
  CLI::App::~App(&(this->super_SubcommandProgram).super_TApp.app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, Multiple) {
    args = {"-d", "start", "-ffilename", "stop"};

    run();
    EXPECT_EQ((size_t)2, app.get_subcommands().size());
    EXPECT_EQ(1, dummy);
    EXPECT_EQ("filename", file);
}